

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetItemDefaultFocus(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImGuiWindow *window;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiContext *g;
  
  pIVar6 = GImGui;
  window = GImGui->CurrentWindow;
  if ((((window->Appearing == true) && (GImGui->NavWindow == window->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (window->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar6->NavInitResultId = (pIVar6->LastItemData).ID;
    fVar1 = (window->DC).CursorStartPos.x;
    fVar2 = (window->DC).CursorStartPos.y;
    fVar3 = (pIVar6->LastItemData).Rect.Min.y;
    fVar4 = (pIVar6->LastItemData).Rect.Max.x;
    fVar5 = (pIVar6->LastItemData).Rect.Max.y;
    (pIVar6->NavInitResultRectRel).Min.x = (pIVar6->LastItemData).Rect.Min.x - fVar1;
    (pIVar6->NavInitResultRectRel).Min.y = fVar3 - fVar2;
    (pIVar6->NavInitResultRectRel).Max.x = fVar4 - fVar1;
    (pIVar6->NavInitResultRectRel).Max.y = fVar5 - fVar2;
    if (pIVar6->NavMoveScoringItems == false) {
      pIVar6->NavAnyRequest = false;
    }
    else {
      pIVar6->NavAnyRequest = true;
      if (pIVar6->NavWindow == (ImGuiWindow *)0x0) {
        __assert_fail("g.NavWindow != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x2986,"void ImGui::NavUpdateAnyRequestFlag()");
      }
    }
    bVar7 = IsItemVisible();
    if (!bVar7) {
      ScrollToRectEx(window,&(pIVar6->LastItemData).Rect,0);
      return;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow != window->RootWindowForNav || (!g.NavInitRequest && g.NavInitResultId == 0) || g.NavLayer != window->DC.NavLayerCurrent)
        return;

    g.NavInitRequest = false;
    g.NavInitResultId = g.LastItemData.ID;
    g.NavInitResultRectRel = WindowRectAbsToRel(window, g.LastItemData.Rect);
    NavUpdateAnyRequestFlag();

    // Scroll could be done in NavInitRequestApplyResult() via a opt-in flag (we however don't want regular init requests to scroll)
    if (!IsItemVisible())
        ScrollToRectEx(window, g.LastItemData.Rect, ImGuiScrollFlags_None);
}